

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

void __thiscall
trun::TestResponseProxy::QueryInterface(TestResponseProxy *this,uint32_t interface_id,void **outPtr)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  
  if (outPtr == (void **)0x0) {
    (*this->pLogger->_vptr_ILogger[4])(this->pLogger,"QueryInterface, outPtr is null");
  }
  if (interface_id == 0xc07f19) {
    (*this->pLogger->_vptr_ILogger[7])
              (this->pLogger,"QueryInterface, interface_id = %d, returning TRUN_IConfig",0xc07f19);
    *outPtr = &GetTRConfigInterface::trp_config_bridge;
    return;
  }
  *outPtr = (void *)0x0;
  UNRECOVERED_JUMPTABLE = this->pLogger->_vptr_ILogger[7];
  (*UNRECOVERED_JUMPTABLE)
            (this->pLogger,"QueryInterface, invalid interface id (%d)",interface_id,
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TestResponseProxy::QueryInterface(uint32_t interface_id, void **outPtr) {
    if (outPtr == nullptr) {
        pLogger->Error("QueryInterface, outPtr is null");
    }

    switch(interface_id) {
        case ITestingConfig_IFace_ID :
            pLogger->Debug("QueryInterface, interface_id = %d, returning TRUN_IConfig", interface_id);
            *outPtr = (void *)GetTRConfigInterface();
            break;
        default :
            *outPtr = nullptr;
            pLogger->Debug("QueryInterface, invalid interface id (%d)", interface_id);
            break;
    }

}